

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O1

string * miniros::network::determineHost_abi_cxx11_(void)

{
  sockaddr *__sa;
  Level level;
  void *logger_handle;
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  ifaddrs *piVar8;
  socklen_t __salen;
  string *in_RDI;
  string ip_env;
  string local_640;
  long *local_620;
  long local_618;
  long local_610;
  long lStack_608;
  ifaddrs *ifp;
  long *local_5f8 [2];
  long local_5e8 [2];
  char preferred_ip [200];
  char ip_ [200];
  char host [1024];
  
  ip_env._M_dataplus._M_p = (pointer)&ip_env.field_2;
  ip_env._M_string_length = 0;
  ip_env.field_2._M_local_buf[0] = '\0';
  bVar2 = get_environment_variable(&ip_env,"ROS_HOSTNAME");
  if (bVar2) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (determineHost::loc.initialized_ == false) {
      ip_._0_8_ = ip_ + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)ip_,"miniros.unknown_package","");
      plVar5 = (long *)std::__cxx11::string::append(ip_);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        preferred_ip._16_8_ = *plVar6;
        preferred_ip._24_8_ = plVar5[3];
        preferred_ip._0_8_ = preferred_ip + 0x10;
      }
      else {
        preferred_ip._16_8_ = *plVar6;
        preferred_ip._0_8_ = (long *)*plVar5;
      }
      preferred_ip._8_8_ = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(preferred_ip);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        host._16_8_ = *plVar6;
        host._24_8_ = plVar5[3];
        host._0_8_ = host + 0x10;
      }
      else {
        host._16_8_ = *plVar6;
        host._0_8_ = (long *)*plVar5;
      }
      host._8_8_ = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      console::initializeLogLocation(&determineHost::loc,(string *)host,Debug);
      if ((char *)host._0_8_ != host + 0x10) {
        operator_delete((void *)host._0_8_,host._16_8_ + 1);
      }
      if ((char *)preferred_ip._0_8_ != preferred_ip + 0x10) {
        operator_delete((void *)preferred_ip._0_8_,preferred_ip._16_8_ + 1);
      }
      if ((char *)ip_._0_8_ != ip_ + 0x10) {
        operator_delete((void *)ip_._0_8_,ip_._16_8_ + 1);
      }
    }
    if (determineHost::loc.level_ != Debug) {
      console::setLogLocationLevel(&determineHost::loc,Debug);
      console::checkLogLocationEnabled(&determineHost::loc);
    }
    if (determineHost::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,determineHost::loc.logger_,determineHost::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                     ,0x5b,"std::string miniros::network::determineHost()",
                     "determineIP: using value of ROS_HOSTNAME:%s:",ip_env._M_dataplus._M_p);
    }
    if (ip_env._M_string_length == 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
        host._0_8_ = host + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)host,"miniros.unknown_package","")
        ;
        console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,(string *)host,Warn);
        if ((char *)host._0_8_ != host + 0x10) {
          operator_delete((void *)host._0_8_,host._16_8_ + 1);
        }
      }
      if (determineHost[abi:cxx11]()::loc.level_ != Warn) {
        console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Warn);
        console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
      }
      if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                       determineHost[abi:cxx11]()::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                       ,0x5d,"std::string miniros::network::determineHost()",
                       "invalid ROS_HOSTNAME (an empty string)");
      }
    }
  }
  else {
    bVar2 = get_environment_variable(&ip_env,"ROS_IP");
    if (!bVar2) {
      memset(host,0,0x400);
      iVar3 = gethostname(host,0x3ff);
      if (iVar3 == 0) {
        if ((host[0] != '\0') && (host._8_2_ != 0x74 || host._0_8_ != 0x736f686c61636f6c)) {
          (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
          strlen(host);
          std::__cxx11::string::_M_construct<char_const*>();
          goto LAB_001e82fe;
        }
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
          preferred_ip._0_8_ = preferred_ip + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)preferred_ip,"miniros.unknown_package","");
          console::initializeLogLocation
                    (&determineHost[abi:cxx11]()::loc,(string *)preferred_ip,Error);
          if ((char *)preferred_ip._0_8_ != preferred_ip + 0x10) {
            operator_delete((void *)preferred_ip._0_8_,preferred_ip._16_8_ + 1);
          }
        }
        if (determineHost[abi:cxx11]()::loc.level_ != Error) {
          console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Error);
          console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
        }
        if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                         determineHost[abi:cxx11]()::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                         ,0x6f,"std::string miniros::network::determineHost()",
                         "determineIP: gethostname failed");
        }
      }
      ifp = (ifaddrs *)0x0;
      iVar3 = getifaddrs();
      if (iVar3 < 0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
          preferred_ip._0_8_ = preferred_ip + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)preferred_ip,"miniros.unknown_package","");
          console::initializeLogLocation
                    (&determineHost[abi:cxx11]()::loc,(string *)preferred_ip,Fatal);
          if ((char *)preferred_ip._0_8_ != preferred_ip + 0x10) {
            operator_delete((void *)preferred_ip._0_8_,preferred_ip._16_8_ + 1);
          }
        }
        if (determineHost[abi:cxx11]()::loc.level_ != Fatal) {
          console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Fatal);
          console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
        }
        logger_handle = determineHost[abi:cxx11]()::loc.logger_;
        level = determineHost[abi:cxx11]()::loc.level_;
        if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
          pcVar4 = strerror(iVar3);
          console::print((FilterBase *)0x0,logger_handle,level,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                         ,0x7c,"std::string miniros::network::determineHost()",
                         "error in getifaddrs: [%s]",pcVar4);
        }
      }
      memset(preferred_ip,0,200);
      if (ifp != (ifaddrs *)0x0) {
        piVar8 = ifp;
        do {
          __sa = (sockaddr *)piVar8->ifa_addr;
          if (__sa != (sockaddr *)0x0) {
            if (__sa->sa_family == 2) {
              __salen = 0x10;
            }
            else {
              if (__sa->sa_family != 10) goto LAB_001e8507;
              __salen = 0x1c;
            }
            iVar3 = getnameinfo(__sa,__salen,ip_,200,(char *)0x0,0,1);
            if (iVar3 < 0) {
              if (console::g_initialized == '\0') {
                console::initialize();
              }
              if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
                local_5f8[0] = local_5e8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_5f8,"miniros.unknown_package","");
                plVar5 = (long *)std::__cxx11::string::append((char *)local_5f8);
                plVar6 = plVar5 + 2;
                if ((long *)*plVar5 == plVar6) {
                  local_610 = *plVar6;
                  lStack_608 = plVar5[3];
                  local_620 = &local_610;
                }
                else {
                  local_610 = *plVar6;
                  local_620 = (long *)*plVar5;
                }
                local_618 = plVar5[1];
                *plVar5 = (long)plVar6;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_620);
                local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
                psVar7 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar7) {
                  local_640.field_2._M_allocated_capacity = *psVar7;
                  local_640.field_2._8_8_ = plVar5[3];
                }
                else {
                  local_640.field_2._M_allocated_capacity = *psVar7;
                  local_640._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_640._M_string_length = plVar5[1];
                *plVar5 = (long)psVar7;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,&local_640,Debug);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_640._M_dataplus._M_p != &local_640.field_2) {
                  operator_delete(local_640._M_dataplus._M_p,
                                  local_640.field_2._M_allocated_capacity + 1);
                }
                if (local_620 != &local_610) {
                  operator_delete(local_620,local_610 + 1);
                }
                if (local_5f8[0] != local_5e8) {
                  operator_delete(local_5f8[0],local_5e8[0] + 1);
                }
              }
              if (determineHost[abi:cxx11]()::loc.level_ != Debug) {
                console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Debug);
                console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
              }
              if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
                console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                               determineHost[abi:cxx11]()::loc.level_,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                               ,0x8c,"std::string miniros::network::determineHost()",
                               "getnameinfo couldn\'t get the ip of interface [%s]",piVar8->ifa_name
                              );
              }
            }
            else if (((ip_._8_2_ != 0x31 || ip_._0_8_ != 0x2e302e302e373231) &&
                     (pcVar4 = strchr(ip_,0x3a), pcVar4 == (char *)0x0)) &&
                    (((cVar1 = preferred_ip[0],
                      preferred_ip[0] == '\0' && piVar8->ifa_addr->sa_family == 10 ||
                      (bVar2 = isPrivateIP(ip_), bVar2 && cVar1 == '\0')) ||
                     ((!bVar2 && (bVar2 = isPrivateIP(preferred_ip), bVar2 || cVar1 == '\0')))))) {
              strcpy(preferred_ip,ip_);
            }
          }
LAB_001e8507:
          piVar8 = piVar8->ifa_next;
        } while (piVar8 != (ifaddrs *)0x0);
      }
      freeifaddrs();
      if (preferred_ip[0] == '\0') {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
          local_620 = &local_610;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_620,"miniros.unknown_package","");
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_620);
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_640.field_2._M_allocated_capacity = *psVar7;
            local_640.field_2._8_8_ = plVar5[3];
            local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
          }
          else {
            local_640.field_2._M_allocated_capacity = *psVar7;
            local_640._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_640._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_640);
          plVar6 = plVar5 + 2;
          if ((long *)*plVar5 == plVar6) {
            ip_._16_8_ = *plVar6;
            ip_._24_8_ = plVar5[3];
            ip_._0_8_ = ip_ + 0x10;
          }
          else {
            ip_._16_8_ = *plVar6;
            ip_._0_8_ = (long *)*plVar5;
          }
          ip_._8_8_ = plVar5[1];
          *plVar5 = (long)plVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,(string *)ip_,Error);
          if ((char *)ip_._0_8_ != ip_ + 0x10) {
            operator_delete((void *)ip_._0_8_,ip_._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_640._M_dataplus._M_p != &local_640.field_2) {
            operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
          }
          if (local_620 != &local_610) {
            operator_delete(local_620,local_610 + 1);
          }
        }
        if (determineHost[abi:cxx11]()::loc.level_ != Error) {
          console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Error);
          console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
        }
        if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                         determineHost[abi:cxx11]()::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                         ,0x9f,"std::string miniros::network::determineHost()",
                         "Couldn\'t find a preferred IP via the getifaddrs() call; I\'m assuming that your IP address is 127.0.0.1.  This should work for local processes, but will almost certainly not work if you have remote processes.Report to the ROS development team to seek a fix."
                        );
        }
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        std::__cxx11::string::_M_construct<char_const*>();
      }
      else {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
          local_620 = &local_610;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_620,"miniros.unknown_package","");
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_620);
          psVar7 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_640.field_2._M_allocated_capacity = *psVar7;
            local_640.field_2._8_8_ = plVar5[3];
            local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
          }
          else {
            local_640.field_2._M_allocated_capacity = *psVar7;
            local_640._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_640._M_string_length = plVar5[1];
          *plVar5 = (long)psVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_640);
          plVar6 = plVar5 + 2;
          if ((long *)*plVar5 == plVar6) {
            ip_._16_8_ = *plVar6;
            ip_._24_8_ = plVar5[3];
            ip_._0_8_ = ip_ + 0x10;
          }
          else {
            ip_._16_8_ = *plVar6;
            ip_._0_8_ = (long *)*plVar5;
          }
          ip_._8_8_ = plVar5[1];
          *plVar5 = (long)plVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,(string *)ip_,Debug);
          if ((char *)ip_._0_8_ != ip_ + 0x10) {
            operator_delete((void *)ip_._0_8_,ip_._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_640._M_dataplus._M_p != &local_640.field_2) {
            operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
          }
          if (local_620 != &local_610) {
            operator_delete(local_620,local_610 + 1);
          }
        }
        if (determineHost[abi:cxx11]()::loc.level_ != Debug) {
          console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Debug);
          console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
        }
        if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                         determineHost[abi:cxx11]()::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                         ,0xa2,"std::string miniros::network::determineHost()",
                         "preferred IP is guessed to be %s",preferred_ip);
        }
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        strlen(preferred_ip);
        std::__cxx11::string::_M_construct<char_const*>();
      }
      goto LAB_001e82fe;
    }
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
      host._0_8_ = host + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)host,"miniros.unknown_package","");
      console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,(string *)host,Debug);
      if ((char *)host._0_8_ != host + 0x10) {
        operator_delete((void *)host._0_8_,host._16_8_ + 1);
      }
    }
    if (determineHost[abi:cxx11]()::loc.level_ != Debug) {
      console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Debug);
      console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
    }
    if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                     determineHost[abi:cxx11]()::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                     ,100,"std::string miniros::network::determineHost()",
                     "determineIP: using value of ROS_IP:%s:",ip_env._M_dataplus._M_p);
    }
    if (ip_env._M_string_length == 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (determineHost[abi:cxx11]()::loc.initialized_ == false) {
        host._0_8_ = host + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)host,"miniros.unknown_package","")
        ;
        console::initializeLogLocation(&determineHost[abi:cxx11]()::loc,(string *)host,Warn);
        if ((char *)host._0_8_ != host + 0x10) {
          operator_delete((void *)host._0_8_,host._16_8_ + 1);
        }
      }
      if (determineHost[abi:cxx11]()::loc.level_ != Warn) {
        console::setLogLocationLevel(&determineHost[abi:cxx11]()::loc,Warn);
        console::checkLogLocationEnabled(&determineHost[abi:cxx11]()::loc);
      }
      if (determineHost[abi:cxx11]()::loc.logger_enabled_ == true) {
        console::print((FilterBase *)0x0,determineHost[abi:cxx11]()::loc.logger_,
                       determineHost[abi:cxx11]()::loc.level_,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/network.cpp"
                       ,0x66,"std::string miniros::network::determineHost()",
                       "invalid ROS_IP (an empty string)");
      }
    }
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ip_env._M_dataplus._M_p == &ip_env.field_2) {
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(ip_env.field_2._M_allocated_capacity._1_7_,ip_env.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = ip_env.field_2._8_8_;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = ip_env._M_dataplus._M_p;
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(ip_env.field_2._M_allocated_capacity._1_7_,ip_env.field_2._M_local_buf[0]);
  }
  in_RDI->_M_string_length = ip_env._M_string_length;
  ip_env._M_string_length = 0;
  ip_env.field_2._M_local_buf[0] = '\0';
  ip_env._M_dataplus._M_p = (pointer)&ip_env.field_2;
LAB_001e82fe:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ip_env._M_dataplus._M_p != &ip_env.field_2) {
    operator_delete(ip_env._M_dataplus._M_p,
                    CONCAT71(ip_env.field_2._M_allocated_capacity._1_7_,
                             ip_env.field_2._M_local_buf[0]) + 1);
  }
  return in_RDI;
}

Assistant:

std::string determineHost()
{
  std::string ip_env;
  // First, did the user set ROS_HOSTNAME?
  if (get_environment_variable(ip_env, "ROS_HOSTNAME")) {
    MINIROS_DEBUG_NAMED("roscxx", "determineIP: using value of ROS_HOSTNAME:%s:", ip_env.c_str());
    if (ip_env.size() == 0) {
      MINIROS_WARN("invalid ROS_HOSTNAME (an empty string)");
    }
    return ip_env;
  }

  // Second, did the user set ROS_IP?
  if (get_environment_variable(ip_env, "ROS_IP")) {
    MINIROS_DEBUG("determineIP: using value of ROS_IP:%s:", ip_env.c_str());
    if (ip_env.size() == 0) {
      MINIROS_WARN("invalid ROS_IP (an empty string)");
    }
    return ip_env;
  }

  // Third, try the hostname
  char host[1024];
  memset(host, 0, sizeof(host));
  if (gethostname(host, sizeof(host) - 1) != 0) {
    MINIROS_ERROR("determineIP: gethostname failed");
  }
  // We don't want localhost to be our ip
  else if (strlen(host) && strcmp("localhost", host)) {
    return std::string(host);
  }

  // Fourth, fall back on interface search, which will yield an IP address

#ifdef HAVE_IFADDRS_H
  struct ifaddrs *ifa = NULL, *ifp = NULL;
  int rc;
  if ((rc = getifaddrs(&ifp)) < 0) {
    MINIROS_FATAL("error in getifaddrs: [%s]", strerror(rc));
    MINIROS_BREAK();
  }
  char preferred_ip[200] = {0};
  for (ifa = ifp; ifa; ifa = ifa->ifa_next) {
    char ip_[200];
    socklen_t salen;
    if (!ifa->ifa_addr)
      continue; // evidently this interface has no ip address
    if (ifa->ifa_addr->sa_family == AF_INET)
      salen = sizeof(struct sockaddr_in);
    else if (ifa->ifa_addr->sa_family == AF_INET6)
      salen = sizeof(struct sockaddr_in6);
    else
      continue;
    if (getnameinfo(ifa->ifa_addr, salen, ip_, sizeof(ip_), NULL, 0, NI_NUMERICHOST) < 0) {
      MINIROS_DEBUG_NAMED("roscxx", "getnameinfo couldn't get the ip of interface [%s]", ifa->ifa_name);
      continue;
    }
    // ROS_INFO( "ip of interface [%s] is [%s]", ifa->ifa_name, ip);
    //  prefer non-private IPs over private IPs
    if (!strcmp("127.0.0.1", ip_) || strchr(ip_, ':'))
      continue; // ignore loopback unless we have no other choice
    if (ifa->ifa_addr->sa_family == AF_INET6 && !preferred_ip[0])
      strcpy(preferred_ip, ip_);
    else if (isPrivateIP(ip_) && !preferred_ip[0])
      strcpy(preferred_ip, ip_);
    else if (!isPrivateIP(ip_) && (isPrivateIP(preferred_ip) || !preferred_ip[0]))
      strcpy(preferred_ip, ip_);
  }
  freeifaddrs(ifp);
  if (!preferred_ip[0]) {
    MINIROS_ERROR_NAMED("roscxx", "Couldn't find a preferred IP via the getifaddrs() call; I'm assuming that your IP "
                                  "address is 127.0.0.1.  This should work for local processes, "
                                  "but will almost certainly not work if you have remote processes."
                                  "Report to the ROS development team to seek a fix.");
    return std::string("127.0.0.1");
  }
  MINIROS_DEBUG_NAMED("roscxx", "preferred IP is guessed to be %s", preferred_ip);
  return std::string(preferred_ip);
#else
  // @todo Fix IP determination in the case where getifaddrs() isn't
  // available.
  MINIROS_ERROR("You don't have the getifaddrs() call; I'm assuming that your IP "
                "address is 127.0.0.1.  This should work for local processes, "
                "but will almost certainly not work if you have remote processes."
                "Report to the ROS development team to seek a fix.");
  return std::string("127.0.0.1");
#endif
}